

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmder_.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  int n;
  int ldfjac;
  int one;
  int m;
  double local_3a8;
  int local_3a0;
  int njev;
  int mode;
  int maxfev;
  double ftol;
  double gtol;
  double xtol;
  int nfev;
  int info;
  int nprint;
  double local_368 [3];
  int ipvt [3];
  double factor;
  double wa1 [3];
  double wa3 [3];
  double wa2 [3];
  double qtf [3];
  double diag [3];
  double wa4 [15];
  double fjac [45];
  double fvec [15];
  
  one = 1;
  ldfjac = 0xf;
  n = 3;
  local_368[0] = 1.0;
  local_368[1] = 1.0;
  local_368[2] = 1.0;
  m = ldfjac;
  dVar9 = dpmpar_(&one);
  if (dVar9 < 0.0) {
    ftol = sqrt(dVar9);
  }
  else {
    ftol = SQRT(dVar9);
  }
  dVar9 = dpmpar_(&one);
  if (dVar9 < 0.0) {
    xtol = sqrt(dVar9);
  }
  else {
    xtol = SQRT(dVar9);
  }
  gtol = 0.0;
  maxfev = 400;
  mode = 1;
  factor = 100.0;
  nprint = 0;
  lmder_(fcn,&m,&n,local_368,fvec,fjac,&ldfjac,&ftol,&xtol,&gtol,&maxfev,diag,&mode,&factor,&nprint,
         &info,&nfev,&njev,ipvt,qtf,wa1,wa2,wa3,wa4);
  local_3a8 = enorm_(&m,fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n");
  printf("      number of function evaluations%10i\n\n",(ulong)(uint)nfev);
  printf("      number of Jacobian evaluations%10i\n\n",(ulong)(uint)njev);
  printf("      exit parameter                %10i\n\n",(ulong)(uint)info);
  puts("      final approximate solution");
  uVar3 = 1;
  while( true ) {
    if ((long)n < (long)uVar3) break;
    pcVar5 = "\n     ";
    if ((int)((uVar3 & 0xffffffff) / 3) * -3 + (int)uVar3 != 1) {
      pcVar5 = "";
    }
    printf("%s%15.7g",*(undefined8 *)(&info + uVar3 * 2),pcVar5,(uVar3 & 0xffffffff) % 3);
    uVar3 = uVar3 + 1;
  }
  putchar(10);
  ftol = dpmpar_(&one);
  local_3a8 = (local_3a8 * local_3a8) / (double)(m - n);
  covar_(&n,fjac,&ldfjac,ipvt,&ftol,wa1);
  puts("      covariance");
  iVar7 = 0;
  iVar1 = 1;
  iVar2 = n;
  while (iVar1 <= iVar2) {
    iVar8 = 0;
    uVar4 = 1;
    iVar6 = 0;
    local_3a0 = iVar1;
    while( true ) {
      if (iVar2 < iVar6 + 1) break;
      pcVar5 = "\n     ";
      if ((uVar4 / 3) * 3 + iVar8 != 0) {
        pcVar5 = "";
      }
      printf("%s%15.7g",fjac[iVar6 + ldfjac * iVar7] * local_3a8,pcVar5);
      uVar4 = uVar4 + 1;
      iVar8 = iVar8 + -1;
      iVar6 = iVar6 + 1;
      iVar2 = n;
    }
    iVar7 = iVar7 + 1;
    iVar1 = local_3a0 + 1;
  }
  putchar(10);
  return 0;
}

Assistant:

int main()
{
  int i, j, m, n, ldfjac, maxfev, mode, nprint, info, nfev, njev;
  int ipvt[3];
  real ftol, xtol, gtol, factor, fnorm;
  real x[3], fvec[15], fjac[15*3], diag[3], qtf[3], 
    wa1[3], wa2[3], wa3[3], wa4[15];
  int one=1;
  real covfac;

  m = 15;
  n = 3;

/*      the following starting values provide a rough fit. */

  x[1-1] = 1.;
  x[2-1] = 1.;
  x[3-1] = 1.;

  ldfjac = 15;

  /*      set ftol and xtol to the square root of the machine */
  /*      and gtol to zero. unless high solutions are */
  /*      required, these are the recommended settings. */

  ftol = sqrt(__minpack_func__(dpmpar)(&one));
  xtol = sqrt(__minpack_func__(dpmpar)(&one));
  gtol = 0.;
    
  maxfev = 400;
  mode = 1;
  factor = 1.e2;
  nprint = 0;

  __minpack_func__(lmder)(&fcn, &m, &n, x, fvec, fjac, &ldfjac, &ftol, &xtol, &gtol, 
	&maxfev, diag, &mode, &factor, &nprint, &info, &nfev, &njev, 
	ipvt, qtf, wa1, wa2, wa3, wa4);
  fnorm = __minpack_func__(enorm)(&m, fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
  printf("      number of function evaluations%10i\n\n", nfev);
  printf("      number of Jacobian evaluations%10i\n\n", njev);
  printf("      exit parameter                %10i\n\n", info);
  printf("      final approximate solution\n");
  for (j=1; j<=n; j++) {
    printf("%s%15.7g", j%3==1?"\n     ":"", (double)x[j-1]);
  }
  printf("\n");
  ftol = __minpack_func__(dpmpar)(&one);
  covfac = fnorm*fnorm/(m-n);
  __minpack_func__(covar)(&n, fjac, &ldfjac, ipvt, &ftol, wa1);
  printf("      covariance\n");
  for (i=1; i<=n; i++) {
    for (j=1; j<=n; j++) {
      printf("%s%15.7g", j%3==1?"\n     ":"", (double)(fjac[(i-1)*ldfjac+j-1]*covfac));
    }
  }
  printf("\n");
  return 0;
}